

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O2

void __thiscall
poplar::compact_bonsai_nlm<int,16ul>::
expand<poplar::plain_bonsai_trie<90u,poplar::hash::vigna_hasher>::node_map>
          (compact_bonsai_nlm<int,16ul> *this,node_map *pos_map)

{
  long lVar1;
  uint64_t uVar2;
  uint uVar3;
  uint32_t capa_bits;
  uint64_t pos;
  ulong i;
  char_range new_slice;
  compact_bonsai_nlm<int,_16UL> local_70;
  
  lVar1 = (*(long *)(this + 8) - *(long *)this) * 4;
  capa_bits = 0x40 - (int)LZCOUNT(lVar1 + -1);
  i = 0;
  if (lVar1 == 0) {
    capa_bits = 0;
  }
  compact_bonsai_nlm<int,_16UL>::compact_bonsai_nlm(&local_70,capa_bits);
  for (; i < (pos_map->map_).size_; i = i + 1) {
    uVar2 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::operator[](pos_map,i);
    uVar3 = (uint)i & 0xf;
    if (uVar2 != 0xffffffffffffffff) {
      new_slice = compact_bonsai_nlm<int,_16UL>::get_slice_
                            ((compact_bonsai_nlm<int,_16UL> *)this,i >> 4,(ulong)uVar3);
      if (new_slice.begin != new_slice.end) {
        compact_bonsai_nlm<int,_16UL>::set_slice_
                  (&local_70,uVar2 >> 4,(ulong)((uint)uVar2 & 0xf),new_slice);
      }
    }
    if (uVar3 == 0xf) {
      std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
                ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
                 ((i >> 4) * 8 + *(long *)this),(pointer)0x0);
    }
  }
  local_70.size_ = *(uint64_t *)(this + 0x30);
  local_70.label_bytes_ = *(uint64_t *)(this + 0x38);
  compact_bonsai_nlm<int,_16UL>::operator=((compact_bonsai_nlm<int,_16UL> *)this,&local_70);
  compact_bonsai_nlm<int,_16UL>::~compact_bonsai_nlm(&local_70);
  return;
}

Assistant:

void expand(const T& pos_map) {
        this_type new_ls(bit_tools::ceil_log2(ptrs_.size() * ChunkSize * 2));

        for (uint64_t pos = 0; pos < pos_map.size(); ++pos) {
            auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);
            uint64_t new_pos = pos_map[pos];
            if (new_pos != UINT64_MAX) {
                auto orig_slice = get_slice_(chunk_id, pos_in_chunk);
                if (!orig_slice.empty()) {
                    auto [new_chunk_id, new_pos_in_chunk] = decompose_value<ChunkSize>(new_pos);
                    new_ls.set_slice_(new_chunk_id, new_pos_in_chunk, orig_slice);
                }
            }
            if (pos_in_chunk == ChunkSize - 1) {
                ptrs_[chunk_id].reset();
            }
        }

        new_ls.size_ = size_;
#ifdef POPLAR_EXTRA_STATS
        new_ls.max_length_ = max_length_;
        new_ls.sum_length_ = sum_length_;
#endif
        new_ls.label_bytes_ = label_bytes_;
        *this = std::move(new_ls);
    }